

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

CommandSignature __thiscall
anon_unknown.dwarf_6d54c::ClangShellCommand::getSignature(ClangShellCommand *this)

{
  pointer pSVar1;
  CommandSignature CVar2;
  StringRef *v;
  pointer pSVar3;
  StringRef local_c0;
  hash_combine_recursive_helper local_b0;
  
  CVar2 = llbuild::buildsystem::ExternalCommand::getSignature(&this->super_ExternalCommand);
  pSVar3 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 != pSVar1) {
    do {
      local_c0.Data = pSVar3->Data;
      local_c0.Length = pSVar3->Length;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer._0_8_ = CVar2.value;
      CVar2.value = (uint64_t)
                    llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                              (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  return (CommandSignature)CVar2.value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    return ExternalCommand::getSignature()
        .combine(args);
  }